

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall ImFontAtlas::AddFontDefault(ImFontAtlas *this,ImFontConfig *font_cfg_template)

{
  char *compressed_ttf_data_base85;
  ImWchar *glyph_ranges;
  ImFont *pIVar1;
  ImFont *font;
  char *ttf_compressed_base85;
  ImFontConfig font_cfg;
  ImFontConfig *font_cfg_template_local;
  ImFontAtlas *this_local;
  
  font_cfg.DstFont = (ImFont *)font_cfg_template;
  if (font_cfg_template == (ImFontConfig *)0x0) {
    ImFontConfig::ImFontConfig((ImFontConfig *)&ttf_compressed_base85);
  }
  else {
    memcpy(&ttf_compressed_base85,font_cfg_template,0x68);
  }
  if (font_cfg.DstFont == (ImFont *)0x0) {
    font_cfg.SizePixels = 1.4013e-45;
    font_cfg.FontNo = 1;
    font_cfg.OversampleH._0_1_ = 1;
  }
  if (font_cfg.GlyphRanges._2_1_ == '\0') {
    strcpy((char *)((long)&font_cfg.GlyphRanges + 2),"<default>");
  }
  compressed_ttf_data_base85 = GetDefaultCompressedFontDataTTFBase85();
  glyph_ranges = GetGlyphRangesDefault(this);
  pIVar1 = AddFontFromMemoryCompressedBase85TTF
                     (this,compressed_ttf_data_base85,13.0,(ImFontConfig *)&ttf_compressed_base85,
                      glyph_ranges);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontDefault(const ImFontConfig* font_cfg_template)
{
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (!font_cfg_template)
    {
        font_cfg.OversampleH = font_cfg.OversampleV = 1;
        font_cfg.PixelSnapH = true;
    }
    if (font_cfg.Name[0] == '\0') strcpy(font_cfg.Name, "<default>");

    const char* ttf_compressed_base85 = GetDefaultCompressedFontDataTTFBase85();
    ImFont* font = AddFontFromMemoryCompressedBase85TTF(ttf_compressed_base85, 13.0f, &font_cfg, GetGlyphRangesDefault());
    return font;
}